

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxInputsCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar1);
  }
  else {
    iVar1 = Gia_ObjFaninId2p(p,pObj);
    Vec_IntPush(vNodes,iVar1);
    pGVar2 = Gia_ObjFanin0(pObj);
    Str_MuxInputsCollect_rec(p,pGVar2,vNodes);
    pGVar2 = Gia_ObjFanin1(pObj);
    Str_MuxInputsCollect_rec(p,pGVar2,vNodes);
  }
  return;
}

Assistant:

void Str_MuxInputsCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( !pObj->fMark0 )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    Vec_IntPush( vNodes, Gia_ObjFaninId2p(p, pObj) );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Str_MuxInputsCollect_rec( p, Gia_ObjFanin1(pObj), vNodes );
}